

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedCollator::internalBuildTailoring
          (RuleBasedCollator *this,UnicodeString *rules,int32_t strength,
          UColAttributeValue decompositionMode,UParseError *outParseError,UnicodeString *outReason,
          UErrorCode *errorCode)

{
  ushort uVar1;
  CollationTailoring *pCVar2;
  ushort uVar3;
  BundleImporter importer;
  UVersionInfo noVersion;
  CollationBuilder builder;
  Importer local_288;
  UnicodeString *local_280;
  UParseError *local_278;
  uint8_t local_26c [4];
  UnicodeString local_268;
  CollationBuilder local_228;
  
  local_278 = outParseError;
  pCVar2 = CollationRoot::getRoot(errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (outReason != (UnicodeString *)0x0) {
      uVar1 = (outReason->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = 2;
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar1 & 0x1e;
      }
      (outReason->fUnion).fStackFields.fLengthAndFlags = uVar3;
    }
    local_280 = rules;
    CollationBuilder::CollationBuilder(&local_228,pCVar2,errorCode);
    local_26c[0] = '\0';
    local_26c[1] = '\0';
    local_26c[2] = '\0';
    local_26c[3] = '\0';
    local_288.super_UObject._vptr_UObject = (UObject)&PTR__Importer_003ef2b0;
    pCVar2 = CollationBuilder::parseAndBuild
                       (&local_228,local_280,local_26c,&local_288,local_278,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      Locale::setToBogus(&pCVar2->actualLocale);
      adoptTailoring(this,pCVar2,errorCode);
      if (strength != -1) {
        (*(this->super_Collator).super_UObject._vptr_UObject[0x17])
                  (this,5,(ulong)(uint)strength,errorCode);
      }
      if (decompositionMode != UCOL_DEFAULT) {
        (*(this->super_Collator).super_UObject._vptr_UObject[0x17])
                  (this,4,(ulong)(uint)decompositionMode,errorCode);
      }
    }
    else {
      if (local_228.errorReason != (char *)0x0 && outReason != (UnicodeString *)0x0) {
        UnicodeString::UnicodeString(&local_268,local_228.errorReason,-1,kInvariant);
        UnicodeString::moveFrom(outReason,&local_268);
        UnicodeString::~UnicodeString(&local_268);
      }
      if (pCVar2 != (CollationTailoring *)0x0) {
        (*(pCVar2->super_SharedObject).super_UObject._vptr_UObject[1])(pCVar2);
      }
    }
    CollationRuleParser::Importer::~Importer(&local_288);
    CollationBuilder::~CollationBuilder(&local_228);
  }
  return;
}

Assistant:

void
RuleBasedCollator::internalBuildTailoring(const UnicodeString &rules,
                                          int32_t strength,
                                          UColAttributeValue decompositionMode,
                                          UParseError *outParseError, UnicodeString *outReason,
                                          UErrorCode &errorCode) {
    const CollationTailoring *base = CollationRoot::getRoot(errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(outReason != NULL) { outReason->remove(); }
    CollationBuilder builder(base, errorCode);
    UVersionInfo noVersion = { 0, 0, 0, 0 };
    BundleImporter importer;
    LocalPointer<CollationTailoring> t(builder.parseAndBuild(rules, noVersion,
                                                             &importer,
                                                             outParseError, errorCode));
    if(U_FAILURE(errorCode)) {
        const char *reason = builder.getErrorReason();
        if(reason != NULL && outReason != NULL) {
            *outReason = UnicodeString(reason, -1, US_INV);
        }
        return;
    }
    t->actualLocale.setToBogus();
    adoptTailoring(t.orphan(), errorCode);
    // Set attributes after building the collator,
    // to keep the default settings consistent with the rule string.
    if(strength != UCOL_DEFAULT) {
        setAttribute(UCOL_STRENGTH, (UColAttributeValue)strength, errorCode);
    }
    if(decompositionMode != UCOL_DEFAULT) {
        setAttribute(UCOL_NORMALIZATION_MODE, decompositionMode, errorCode);
    }
}